

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

_Bool run_container_add(run_container_t *run,uint16_t pos)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  int32_t lenarray;
  int iVar4;
  int iVar5;
  uint uVar6;
  rle16_t *prVar7;
  
  prVar7 = run->runs;
  lenarray = run->n_runs;
  uVar2 = interleavedBinarySearch(prVar7,lenarray,pos);
  if ((int)uVar2 < 0) {
    uVar6 = ~uVar2;
    if (uVar2 == 0xffffffff) {
      if ((lenarray < 1) || (pos + 1 != (uint)prVar7->value)) {
LAB_00119d12:
        if (run->capacity <= lenarray) {
          run_container_grow(run,lenarray + 1,true);
          lenarray = run->n_runs;
          prVar7 = run->runs;
        }
        uVar2 = uVar6 & 0xffff;
        memmove(prVar7 + (ulong)uVar2 + 1,prVar7 + uVar2,(long)(int)(lenarray - uVar2) << 2);
        run->n_runs = run->n_runs + 1;
        prVar7 = run->runs;
        prVar7[uVar6].value = pos;
        prVar7[uVar6].length = 0;
      }
      else {
        prVar7->length = prVar7->length + 1;
        prVar7->value = prVar7->value - 1;
      }
    }
    else {
      uVar3 = -uVar2 - 2;
      iVar5 = (uint)pos - (uint)prVar7[uVar3].value;
      if (iVar5 <= (int)(uint)prVar7[uVar3].length) goto LAB_00119c46;
      iVar4 = prVar7[uVar3].length + 1;
      if (iVar5 == iVar4) {
        if ((int)uVar6 < lenarray) {
          if (pos + 1 == (uint)prVar7[uVar6].value) {
            prVar7[uVar3].length =
                 (prVar7[uVar6].value - prVar7[uVar3].value) + prVar7[uVar6].length;
            memmove(prVar7 + (uVar6 & 0xffff),prVar7 + (ulong)(uVar6 & 0xffff) + 1,
                    (long)(int)((uVar2 | 0xffff0000) + lenarray) << 2);
            run->n_runs = run->n_runs + -1;
            goto LAB_00119d66;
          }
        }
        prVar7[uVar3].length = (uint16_t)iVar4;
      }
      else {
        if ((lenarray <= (int)uVar6) || (pos + 1 != (uint)prVar7[uVar6].value)) goto LAB_00119d12;
        prVar7[uVar6].value = pos;
        prVar7[uVar6].length = prVar7[uVar6].length + 1;
      }
    }
LAB_00119d66:
    _Var1 = true;
  }
  else {
LAB_00119c46:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool run_container_add(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return false;  // already there
    index = -index - 2;            // points to preceding value, possibly -1
    if (index >= 0) {              // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return false;  // already there
        if (offset == le + 1) {
            // we may need to fuse
            if (index + 1 < run->n_runs) {
                if (run->runs[index + 1].value == pos + 1) {
                    // indeed fusion is needed
                    run->runs[index].length = run->runs[index + 1].value +
                                              run->runs[index + 1].length -
                                              run->runs[index].value;
                    recoverRoomAtIndex(run, (uint16_t)(index + 1));
                    return true;
                }
            }
            run->runs[index].length++;
            return true;
        }
        if (index + 1 < run->n_runs) {
            // we may need to fuse
            if (run->runs[index + 1].value == pos + 1) {
                // indeed fusion is needed
                run->runs[index + 1].value = pos;
                run->runs[index + 1].length = run->runs[index + 1].length + 1;
                return true;
            }
        }
    }
    if (index == -1) {
        // we may need to extend the first run
        if (0 < run->n_runs) {
            if (run->runs[0].value == pos + 1) {
                run->runs[0].length++;
                run->runs[0].value--;
                return true;
            }
        }
    }
    makeRoomAtIndex(run, (uint16_t)(index + 1));
    run->runs[index + 1].value = pos;
    run->runs[index + 1].length = 0;
    return true;
}